

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandDetector.cpp
# Opt level: O2

void __thiscall HandDetector::getFingers(HandDetector *this)

{
  Hand *pHVar1;
  Hand *this_00;
  ShortHand lastH;
  ShortHand SStack_68;
  
  pHVar1 = *(Hand **)(this + 8);
  for (this_00 = *(Hand **)this; this_00 != pHVar1; this_00 = this_00 + 1) {
    Hand::getSame(&SStack_68,this_00,(vector<ShortHand,_std::allocator<ShortHand>_> *)(this + 0x100)
                 );
    Hand::getFingers(this_00,&SStack_68.fingers);
    std::_Vector_base<ShortFinger,_std::allocator<ShortFinger>_>::~_Vector_base
              (&SStack_68.fingers.super__Vector_base<ShortFinger,_std::allocator<ShortFinger>_>);
  }
  checkHands(this);
  return;
}

Assistant:

void HandDetector::getFingers() {
    for (Hand &h : hands) {
        ShortHand lastH = h.getSame(lastHands);
        h.getFingers(lastH.fingers);
    }
    checkHands();
}